

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathUtils.h
# Opt level: O2

uint32_t slang::clog2(uint64_t value)

{
  long lVar1;
  uint32_t uVar2;
  
  if (value != 0) {
    lVar1 = 0x3f;
    if (value != 0) {
      for (; value >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar2 = 0x40 - ((uint)lVar1 ^ 0x3f);
    if ((-1L << ((byte)lVar1 & 0x3f)) + value == 0) {
      uVar2 = (uint)lVar1;
    }
    return uVar2;
  }
  return 0;
}

Assistant:

inline uint32_t clog2(uint64_t value) {
#if defined(_MSC_VER)
    unsigned long index;
#    if defined(_M_IX86)
    if (value >> 32) {
        _BitScanReverse(&index, (unsigned long)(value >> 32));
        index += 32;
    }
    else if (!_BitScanReverse(&index, (unsigned long)value)) {
        return 0;
    }
#    else
    if (!_BitScanReverse64(&index, value))
        return 0;
#    endif
    return index + (value & (value - 1) ? 1 : 0);
#else
    if (value == 0)
        return 0;
    uint32_t log = sizeof(value) * CHAR_BIT - 1 - (uint32_t)__builtin_clzll(value);
    return (value - (1ULL << log)) ? log + 1 : log;
#endif
}